

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberToString.h
# Opt level: O2

json_string * NumberToString::_uitoa<unsigned_int>(json_string *__return_storage_ptr__,uint val)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  allocator local_15;
  char num_str_result [12];
  
  pcVar3 = num_str_result + 0xb;
  num_str_result[0xb] = '\0';
  uVar2 = (ulong)val;
  do {
    pcVar3[-1] = (byte)(uVar2 % 10) | 0x30;
    pcVar3 = pcVar3 + -1;
    bVar1 = 9 < uVar2;
    uVar2 = uVar2 / 10;
  } while (bVar1);
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,&local_15);
  return __return_storage_ptr__;
}

Assistant:

static json_string _uitoa(T val) json_nothrow {
		  #ifdef JSON_LESS_MEMORY
			 json_auto<json_char> s(getLenSize<sizeof(T)>::GETLEN);
		  #else
			 json_char num_str_result[getLenSize<sizeof(T)>::GETLEN];
		  #endif
		  num_str_result[getLenSize<sizeof(T)>::GETLEN - 1] = JSON_TEXT('\0'); //null terminator
		  json_char * runner = &num_str_result[getLenSize<sizeof(T)>::GETLEN - 2];

		  //create the string
		  START_MEM_SCOPE
			 unsigned long value = (unsigned long)val;
			 do {
				*runner-- = (json_char)(value % 10) + JSON_TEXT('0');
			 } while(value /= 10);
		  END_MEM_SCOPE

		  return json_string(runner + 1);
	   }